

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O1

void __thiscall
dynet::RNNBuilder::start_new_sequence
          (RNNBuilder *this,
          vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *h_0)

{
  if (*(int *)(this + 0x10) != 1) {
    if (*(int *)(this + 0x10) != 0) goto LAB_0012872f;
    dynet::RNNStateMachine::failure((RNNOp)(this + 0x10));
  }
  *(undefined4 *)(this + 0x10) = 2;
LAB_0012872f:
  *(undefined4 *)(this + 8) = 0xffffffff;
  if (*(long *)(this + 0x20) != *(long *)(this + 0x18)) {
    *(long *)(this + 0x20) = *(long *)(this + 0x18);
  }
  (**(code **)(*(long *)this + 0x60))(this,h_0);
  return;
}

Assistant:

void start_new_sequence(const std::vector<Expression>& h_0 = {}) {
    sm.transition(RNNOp::start_new_sequence);
    cur = RNNPointer(-1);
    head.clear();
    start_new_sequence_impl(h_0);
  }